

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__float_array
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  sint16 sVar2;
  ParserTemplateBase *this_00;
  _Map_pointer ppEVar3;
  long *in_RSI;
  ParserChar *in_RDI;
  bool failed_2;
  bool failed_1;
  bool failed;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  float_array__AttributeData *attributeData;
  ParserChar *in_stack_00000088;
  ParserChar *in_stack_00000090;
  StringHash in_stack_00000098;
  ErrorType in_stack_000000a0;
  Severity in_stack_000000a4;
  ParserTemplateBase *in_stack_000000a8;
  undefined5 in_stack_ffffffffffffffa8;
  byte in_stack_ffffffffffffffad;
  byte in_stack_ffffffffffffffae;
  byte in_stack_ffffffffffffffaf;
  ParserTemplateBase *in_stack_ffffffffffffffb0;
  StringHash in_stack_ffffffffffffffb8;
  StringHash in_stack_ffffffffffffffc0;
  ParserChar *text;
  undefined8 *puVar4;
  bool local_1;
  
  this_00 = (ParserTemplateBase *)
            GeneratedSaxParser::ParserTemplateBase::
            newData<COLLADASaxFWL14::float_array__AttributeData>
                      (in_stack_ffffffffffffffb0,
                       (void **)CONCAT17(in_stack_ffffffffffffffaf,
                                         CONCAT16(in_stack_ffffffffffffffae,
                                                  CONCAT15(in_stack_ffffffffffffffad,
                                                           in_stack_ffffffffffffffa8))));
  puVar4 = (undefined8 *)*in_RSI;
  if (puVar4 == (undefined8 *)0x0) {
LAB_0085e857:
    if ((((ulong)(this_00->super_Parser)._vptr_Parser & 1) == 0) &&
       (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                          (this_00,(Severity)((ulong)puVar4 >> 0x20),(ErrorType)puVar4,
                           in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                           (ParserChar *)in_stack_ffffffffffffffb0), bVar1)) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              text = (ParserChar *)*puVar4;
              if (text == (ParserChar *)0x0) {
                in_stack_ffffffffffffffc0 = 0;
                goto LAB_0085e857;
              }
              in_stack_ffffffffffffffb8 = GeneratedSaxParser::Utils::calculateStringHash(text);
              if (puVar4 + 1 == (undefined8 *)0x0) {
                return false;
              }
              in_stack_ffffffffffffffb0 = (ParserTemplateBase *)puVar4[1];
              puVar4 = puVar4 + 2;
              if (in_stack_ffffffffffffffb8 != 0x6f4) break;
              (this_00->super_Parser).mSaxParser = (SaxParser *)in_stack_ffffffffffffffb0;
            }
            if (in_stack_ffffffffffffffb8 != 0x74835) break;
            (this_00->super_Parser).mErrorHandler = (IErrorHandler *)in_stack_ffffffffffffffb0;
          }
          if (in_stack_ffffffffffffffb8 != 0x6a6c54) break;
          ppEVar3 = (_Map_pointer)
                    GeneratedSaxParser::Utils::toUint64
                              (in_RDI,(bool *)((long)&__DT_RELA[0x12b1a].r_addend + 4));
          (this_00->mElementDataStack).
          super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
          ._M_impl.super__Deque_impl_data._M_map = ppEVar3;
          if (((in_stack_ffffffffffffffaf & 1) != 0) &&
             (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                (this_00,(Severity)((ulong)puVar4 >> 0x20),(ErrorType)puVar4,
                                 (StringHash)text,in_stack_ffffffffffffffb8,
                                 (ParserChar *)in_stack_ffffffffffffffb0), bVar1)) {
            return false;
          }
          if ((in_stack_ffffffffffffffaf & 1) == 0) {
            *(uint *)&(this_00->super_Parser)._vptr_Parser =
                 *(uint *)&(this_00->super_Parser)._vptr_Parser | 1;
          }
        }
        if (in_stack_ffffffffffffffb8 == 0x6afe0b3) break;
        if (in_stack_ffffffffffffffb8 == 0xe50c8d5) {
          sVar2 = GeneratedSaxParser::Utils::toSint16(in_RDI,(bool *)0xe50c8d5);
          *(sint16 *)
           ((long)&(this_00->mElementDataStack).
                   super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                   ._M_impl.super__Deque_impl_data._M_map_size + 2) = sVar2;
          if (((in_stack_ffffffffffffffad & 1) != 0) &&
             (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                (this_00,(Severity)((ulong)puVar4 >> 0x20),(ErrorType)puVar4,
                                 (StringHash)text,in_stack_ffffffffffffffb8,
                                 (ParserChar *)in_stack_ffffffffffffffb0), bVar1)) {
            return false;
          }
        }
        else {
          bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                            (in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,in_stack_00000098
                             ,in_stack_00000090,in_stack_00000088);
          if (bVar1) {
            return false;
          }
        }
      }
      sVar2 = GeneratedSaxParser::Utils::toSint16(in_RDI,(bool *)0x6afe0b3);
      *(sint16 *)
       &(this_00->mElementDataStack).
        super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
        ._M_impl.super__Deque_impl_data._M_map_size = sVar2;
    } while (((in_stack_ffffffffffffffae & 1) == 0) ||
            (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                               (this_00,(Severity)((ulong)puVar4 >> 0x20),(ErrorType)puVar4,
                                (StringHash)text,in_stack_ffffffffffffffb8,
                                (ParserChar *)in_stack_ffffffffffffffb0), !bVar1));
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__float_array( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__float_array( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

float_array__AttributeData* attributeData = newData<float_array__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_id:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_name:
    {

attributeData->name = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->name, strlen(attributeData->name));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_FLOAT_ARRAY,
            HASH_ATTRIBUTE_name,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    case HASH_ATTRIBUTE_count:
    {
bool failed;
attributeData->count = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_FLOAT_ARRAY,
        HASH_ATTRIBUTE_count,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= float_array__AttributeData::ATTRIBUTE_COUNT_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_digits:
    {
bool failed;
attributeData->digits = GeneratedSaxParser::Utils::toSint16(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_FLOAT_ARRAY,
        HASH_ATTRIBUTE_digits,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_magnitude:
    {
bool failed;
attributeData->magnitude = GeneratedSaxParser::Utils::toSint16(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_FLOAT_ARRAY,
        HASH_ATTRIBUTE_magnitude,
        attributeValue))
{
    return false;
}

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_FLOAT_ARRAY, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ( (attributeData->present_attributes & float_array__AttributeData::ATTRIBUTE_COUNT_PRESENT) == 0 )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_FLOAT_ARRAY, HASH_ATTRIBUTE_count, 0 ) )
        return false;
}


    return true;
}